

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<std::complex<float>_>::SolveJacobi
          (TPZMatrix<std::complex<float>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<float>_> *F,TPZFMatrix<std::complex<float>_> *result,
          TPZFMatrix<std::complex<float>_> *residual,TPZFMatrix<std::complex<float>_> *scratch,
          REAL *tol,int FromCurrent)

{
  int iVar1;
  int extraout_var;
  long lVar2;
  complex<float> *pcVar3;
  long lVar4;
  long lVar5;
  int64_t ic;
  long col;
  int64_t i;
  long row;
  float fVar6;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  complex<float> local_38;
  
  if (FromCurrent == 0) {
    TPZFMatrix<std::complex<float>_>::operator=(scratch,F);
    (*(result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(result);
  }
  else {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F,scratch);
  }
  fVar6 = Norm(scratch);
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  lVar4 = (F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  lVar5 = 0;
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (CONCAT44(extraout_var,iVar1) == 0 || extraout_var < 0) {
    lVar2 = lVar5;
  }
  if (lVar4 < 1) {
    lVar4 = lVar5;
  }
  while ((lVar5 < *numiterations && (*tol <= (double)ABS(fVar6) && (double)ABS(fVar6) != *tol))) {
    for (col = 0; col != lVar4; col = col + 1) {
      for (row = 0; lVar2 != row; row = row + 1) {
        pcVar3 = TPZFMatrix<std::complex<float>_>::operator()(scratch,row,col);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,row,row);
        std::operator/(pcVar3,&local_38);
        pcVar3 = TPZFMatrix<std::complex<float>_>::operator()(result,row,col);
        pcVar3->_M_value =
             CONCAT44((float)(pcVar3->_M_value >> 0x20) + extraout_XMM0_Db,
                      (float)pcVar3->_M_value + extraout_XMM0_Da);
      }
    }
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F,scratch);
    fVar6 = Norm(scratch);
    lVar5 = lVar5 + 1;
  }
  if (residual != (TPZFMatrix<std::complex<float>_> *)0x0) {
    TPZFMatrix<std::complex<float>_>::operator=(residual,scratch);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveJacobi(int64_t &numiterations,const TPZFMatrix<TVar> &F, TPZFMatrix<TVar> &result,
								  TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch, REAL &tol,const int FromCurrent) {
	
	
	if(FromCurrent) {
		Residual(result,F,scratch);
	} else {
		scratch = F;
		result.Zero();
	}
	REAL res;
	res = TPZExtractVal::val(Norm(scratch));
	int64_t r = Dim();
	int64_t c = F.Cols();
	for(int64_t it=0; it<numiterations && (fabs(res)) > tol; it++) {
		for(int64_t ic=0; ic<c; ic++) {
			for(int64_t i=0; i<r; i++) {
				result(i,ic) += (scratch)(i,ic)/GetVal(i,i);
			}
		}
		Residual(result,F,scratch);
		res = TPZExtractVal::val(Norm(scratch));
	}
	if(residual) *residual = scratch;
}